

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall slang::driver::Driver::processOptions(Driver *this)

{
  string_view str;
  string_view str_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  options;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  bool bVar1;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[10]> _Var2;
  __optional_ne_t<std::__cxx11::basic_string<char>,_char[4]> _Var3;
  __optional_ne_t<std::__cxx11::basic_string<char>,_char[7]> _Var4;
  __optional_ne_t<std::__cxx11::basic_string<char>,_char[6]> _Var5;
  __optional_ne_t<std::__cxx11::basic_string<char>,_char[5]> _Var6;
  __optional_eq_t<bool,_bool> _Var7;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[7]> _Var8;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[6]> _Var9;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[4]> _Var10;
  uint limit;
  optional<slang::TimeScale> oVar11;
  bool *pbVar12;
  size_type sVar13;
  reference pbVar14;
  pointer this_00;
  element_type *this_01;
  DiagnosticEngine *this_02;
  DiagnosticEngine *pDVar15;
  iterator pDVar16;
  iterator pDVar17;
  long in_RDI;
  Diagnostic *diag;
  iterator __end2;
  iterator __begin2;
  Diagnostics *__range2;
  Diagnostics optionDiags;
  element_type *tdc;
  char c;
  const_iterator __end5;
  const_iterator __begin5;
  basic_string_view<char,_std::char_traits<char>_> *__range5;
  basic_string_view<char,_std::char_traits<char>_> part;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range4_1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parts;
  bool bad;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmtStr;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  bool anyBad;
  mapped_type *opt;
  mapped_type *option;
  CompilationFlags flag;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<slang::ast::CompilationFlags> *__range4;
  initializer_list<slang::ast::CompilationFlags> vcsCompatFlags;
  bool showColors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff828;
  Options *in_stack_fffffffffffff830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff838;
  DiagnosticEngine *this_03;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff840;
  DiagnosticEngine *this_04;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff848;
  DiagnosticEngine *pDVar18;
  JsonWriter *in_stack_fffffffffffff850;
  DiagnosticSeverity severity;
  Driver *in_stack_fffffffffffff858;
  allocator<char> *in_stack_fffffffffffff860;
  DiagCode code;
  char *in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  string *in_stack_fffffffffffff878;
  Driver *in_stack_fffffffffffff880;
  undefined8 in_stack_fffffffffffff898;
  size_t in_stack_fffffffffffff8a0;
  char *in_stack_fffffffffffff8a8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  char *in_stack_fffffffffffff8d8;
  undefined1 *puVar19;
  undefined7 in_stack_fffffffffffff8e8;
  byte bVar20;
  DiagnosticEngine *in_stack_fffffffffffff8f0;
  byte local_701;
  DiagnosticEngine *in_stack_fffffffffffff958;
  pointer in_stack_fffffffffffff960;
  SmallVectorBase<slang::Diagnostic> *this_05;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff968;
  SmallVectorBase<slang::Diagnostic> local_688;
  undefined4 local_58c;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  allocator<char> local_501 [33];
  char *local_4e0;
  undefined8 local_4d8;
  undefined1 local_4d0 [39];
  char local_4a9;
  char *local_4a8;
  char *local_4a0;
  basic_string_view<char,_std::char_traits<char>_> *local_498;
  basic_string_view<char,_std::char_traits<char>_> local_490;
  basic_string_view<char,_std::char_traits<char>_> *local_480;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_478;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_470;
  __sv_type local_468;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_458;
  byte local_439;
  reference local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_430;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_428;
  long local_420;
  byte local_418;
  undefined1 local_417;
  _Optional_payload_base<bool> local_416;
  undefined4 local_414;
  _Optional_payload_base<bool> *local_410;
  char *local_408;
  undefined8 local_400;
  undefined1 local_3f8 [32];
  __sv_type local_3d8;
  _Storage<slang::TimeScale,_true> local_3c6;
  undefined1 local_3c2;
  allocator<char> local_3c1 [39];
  undefined1 local_39a;
  undefined1 local_399;
  char *local_398;
  undefined8 local_390;
  undefined1 local_388 [32];
  char *local_368;
  undefined8 local_360;
  undefined1 local_358 [32];
  char *local_338;
  undefined8 local_330;
  undefined1 local_328 [37];
  undefined1 local_303;
  _Optional_payload_base<bool> local_302;
  _Optional_payload_base<bool> *local_300;
  CompilationFlags local_2f4;
  const_iterator local_2f0;
  const_iterator local_2e8;
  initializer_list<slang::ast::CompilationFlags> *local_2e0;
  CompilationFlags local_2d4 [9];
  initializer_list<slang::ast::CompilationFlags> local_2b0 [2];
  char *local_290;
  undefined8 local_288;
  undefined1 local_280 [39];
  bool local_259;
  byte local_249;
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined1 *local_230;
  char *local_228;
  undefined8 uStack_220;
  reference local_218;
  char *local_210;
  undefined8 uStack_208;
  undefined1 *local_200;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  undefined8 uStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  char *local_1c0;
  undefined8 uStack_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined1 *local_190;
  char *local_188;
  undefined8 uStack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  char *local_170;
  undefined8 uStack_168;
  undefined1 *local_160;
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined1 *local_140;
  char *local_138;
  undefined8 uStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  char *local_120;
  undefined8 uStack_118;
  undefined1 *local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined8 uStack_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  char *local_d0;
  undefined8 uStack_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  char *local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  bVar1 = std::optional<bool>::has_value((optional<bool> *)0x2c31a2);
  if (bVar1) {
    pbVar12 = std::optional<bool>::operator*((optional<bool> *)0x2c31c3);
    local_259 = (bool)(*pbVar12 & 1);
  }
  else {
    local_259 = OS::fileSupportsColors((FILE *)0x2c31df);
  }
  if (local_259 != false) {
    OS::setStderrColorsEnabled(true);
    bVar1 = OS::fileSupportsColors((FILE *)0x2c320b);
    if (bVar1) {
      OS::setStdoutColorsEnabled(true);
    }
  }
  bVar1 = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2c3231);
  if (bVar1) {
    _Var2 = std::operator==(&in_stack_fffffffffffff830->languageVersion,
                            (char (*) [10])in_stack_fffffffffffff828);
    if (_Var2) {
      *(undefined4 *)(in_RDI + 0x11a8) = 0;
    }
    else {
      _Var2 = std::operator==(&in_stack_fffffffffffff830->languageVersion,
                              (char (*) [10])in_stack_fffffffffffff828);
      if ((!_Var2) &&
         (_Var8 = std::operator==(&in_stack_fffffffffffff830->languageVersion,
                                  (char (*) [7])in_stack_fffffffffffff828), !_Var8)) {
        local_290 = "invalid value for --std option: \'{}\'";
        local_288 = 0x24;
        local_80 = std::
                   optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)0x2c32f8);
        local_68 = local_280;
        local_78 = local_290;
        uStack_70 = local_288;
        local_98 = local_290;
        uStack_90 = local_288;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        local_58 = &local_a8;
        local_a8 = 0xd;
        fmt.data_._4_4_ = in_stack_fffffffffffffaa4;
        fmt.data_._0_4_ = in_stack_fffffffffffffaa0;
        fmt.size_._0_4_ = in_stack_fffffffffffffaa8;
        fmt.size_._4_4_ = in_stack_fffffffffffffaac;
        args.desc_._4_4_ = in_stack_fffffffffffffa94;
        args.desc_._0_4_ = in_stack_fffffffffffffa90;
        args.field_1._0_4_ = in_stack_fffffffffffffa98;
        args.field_1._4_4_ = in_stack_fffffffffffffa9c;
        local_60 = local_b8;
        local_a0 = local_b8;
        ::fmt::v11::vformat_abi_cxx11_(fmt,args);
        printError(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff830);
        local_249 = 0;
        goto LAB_002c4d05;
      }
      *(undefined4 *)(in_RDI + 0x11a8) = 1;
    }
  }
  bVar1 = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2c3443);
  if (bVar1) {
    _Var10 = std::operator==(&in_stack_fffffffffffff830->languageVersion,
                             (char (*) [4])in_stack_fffffffffffff828);
    if (!_Var10) {
      local_338 = "invalid value for compat option: \'{}\'";
      local_330 = 0x25;
      local_d8 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x2c35c8);
      local_c0 = local_328;
      local_d0 = local_338;
      uStack_c8 = local_330;
      local_e8 = local_338;
      uStack_e0 = local_330;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      local_48 = &local_f8;
      local_f8 = 0xd;
      fmt_00.data_._4_4_ = in_stack_fffffffffffffaa4;
      fmt_00.data_._0_4_ = in_stack_fffffffffffffaa0;
      fmt_00.size_._0_4_ = in_stack_fffffffffffffaa8;
      fmt_00.size_._4_4_ = in_stack_fffffffffffffaac;
      args_00.desc_._4_4_ = in_stack_fffffffffffffa94;
      args_00.desc_._0_4_ = in_stack_fffffffffffffa90;
      args_00.field_1._0_4_ = in_stack_fffffffffffffa98;
      args_00.field_1._4_4_ = in_stack_fffffffffffffa9c;
      local_50 = local_108;
      local_f0 = local_108;
      ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
      printError(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff830);
      local_249 = 0;
      goto LAB_002c4d05;
    }
    memcpy(local_2d4,&DAT_00b08998,0x24);
    local_2b0[0]._M_array = local_2d4;
    local_2b0[0]._M_len = 9;
    local_2e0 = local_2b0;
    local_2e8 = std::initializer_list<slang::ast::CompilationFlags>::begin(local_2e0);
    local_2f0 = std::initializer_list<slang::ast::CompilationFlags>::end
                          ((initializer_list<slang::ast::CompilationFlags> *)
                           in_stack_fffffffffffff830);
    for (; local_2e8 != local_2f0; local_2e8 = local_2e8 + 1) {
      local_2f4 = *local_2e8;
      local_300 = (_Optional_payload_base<bool> *)
                  std::
                  map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
                  ::at((map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
                        *)in_stack_fffffffffffff850,(key_type *)in_stack_fffffffffffff848);
      bVar1 = std::optional<bool>::has_value((optional<bool> *)0x2c3545);
      if (!bVar1) {
        local_303 = 1;
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)in_stack_fffffffffffff830,(bool *)in_stack_fffffffffffff828);
        *local_300 = local_302;
      }
    }
  }
  bVar1 = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2c3711);
  if ((((bVar1) &&
       (_Var3 = std::operator!=(&in_stack_fffffffffffff830->languageVersion,
                                (char (*) [4])in_stack_fffffffffffff828), _Var3)) &&
      (_Var3 = std::operator!=(&in_stack_fffffffffffff830->languageVersion,
                               (char (*) [4])in_stack_fffffffffffff828), _Var3)) &&
     (_Var3 = std::operator!=(&in_stack_fffffffffffff830->languageVersion,
                              (char (*) [4])in_stack_fffffffffffff828), _Var3)) {
    local_368 = "invalid value for timing option: \'{}\'";
    local_360 = 0x25;
    local_128 = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x2c37ca);
    local_110 = local_358;
    local_120 = local_368;
    uStack_118 = local_360;
    local_138 = local_368;
    uStack_130 = local_360;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    local_38 = &local_148;
    local_148 = 0xd;
    fmt_01.data_._4_4_ = in_stack_fffffffffffffaa4;
    fmt_01.data_._0_4_ = in_stack_fffffffffffffaa0;
    fmt_01.size_._0_4_ = in_stack_fffffffffffffaa8;
    fmt_01.size_._4_4_ = in_stack_fffffffffffffaac;
    args_01.desc_._4_4_ = in_stack_fffffffffffffa94;
    args_01.desc_._0_4_ = in_stack_fffffffffffffa90;
    args_01.field_1._0_4_ = in_stack_fffffffffffffa98;
    args_01.field_1._4_4_ = in_stack_fffffffffffffa9c;
    local_40 = local_158;
    local_140 = local_158;
    ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
    printError(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff830);
    local_249 = 0;
  }
  else {
    bVar1 = std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x2c3911);
    if (((bVar1) &&
        (_Var4 = std::operator!=(&in_stack_fffffffffffff830->languageVersion,
                                 (char (*) [7])in_stack_fffffffffffff828), _Var4)) &&
       ((_Var5 = std::operator!=(&in_stack_fffffffffffff830->languageVersion,
                                 (char (*) [6])in_stack_fffffffffffff828), _Var5 &&
        (_Var6 = std::operator!=(&in_stack_fffffffffffff830->languageVersion,
                                 (char (*) [5])in_stack_fffffffffffff828), _Var6)))) {
      local_398 = "invalid value for diag-hierarchy option: \'{}\'";
      local_390 = 0x2d;
      local_178 = std::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x2c39ca);
      local_160 = local_388;
      local_170 = local_398;
      uStack_168 = local_390;
      local_188 = local_398;
      uStack_180 = local_390;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      local_28 = &local_198;
      local_198 = 0xd;
      fmt_02.data_._4_4_ = in_stack_fffffffffffffaa4;
      fmt_02.data_._0_4_ = in_stack_fffffffffffffaa0;
      fmt_02.size_._0_4_ = in_stack_fffffffffffffaa8;
      fmt_02.size_._4_4_ = in_stack_fffffffffffffaac;
      args_02.desc_._4_4_ = in_stack_fffffffffffffa94;
      args_02.desc_._0_4_ = in_stack_fffffffffffffa90;
      args_02.field_1._0_4_ = in_stack_fffffffffffffa98;
      args_02.field_1._4_4_ = in_stack_fffffffffffffa9c;
      local_30 = local_1a8;
      local_190 = local_1a8;
      ::fmt::v11::vformat_abi_cxx11_(fmt_02,args_02);
      printError(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff830);
      local_249 = 0;
    }
    else {
      local_399 = 1;
      _Var7 = std::operator==((optional<bool> *)in_stack_fffffffffffff830,
                              (bool *)in_stack_fffffffffffff828);
      local_701 = 0;
      if (_Var7) {
        local_39a = 0;
        bVar1 = std::optional<bool>::value_or<bool>
                          ((optional<bool> *)in_stack_fffffffffffff838,
                           (bool *)in_stack_fffffffffffff830);
        local_701 = bVar1 ^ 0xff;
      }
      if ((local_701 & 1) == 0) {
        bVar1 = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x2c3c49);
        bVar20 = 0;
        if (bVar1) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2c3c6f);
          local_3d8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff830);
          str_00._M_len._7_1_ = in_stack_fffffffffffff8d7;
          str_00._M_len._0_7_ = in_stack_fffffffffffff8d0;
          str_00._M_str = in_stack_fffffffffffff8d8;
          oVar11 = TimeScale::fromString(str_00);
          local_3c6 = oVar11.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::TimeScale>._M_payload;
          local_3c2 = oVar11.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::TimeScale>._M_engaged;
          bVar1 = std::optional::operator_cast_to_bool((optional<slang::TimeScale> *)0x2c3cbd);
          bVar20 = bVar1 ^ 0xff;
        }
        if ((bVar20 & 1) == 0) {
          bVar1 = Options::lintMode(in_stack_fffffffffffff830);
          if (bVar1) {
            local_414 = 0x80;
            local_410 = (_Optional_payload_base<bool> *)
                        std::
                        map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
                        ::at((map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
                              *)in_stack_fffffffffffff850,(key_type *)in_stack_fffffffffffff848);
            bVar1 = std::optional<bool>::has_value((optional<bool> *)0x2c3e8e);
            if (!bVar1) {
              local_417 = 1;
              std::optional<bool>::optional<bool,_true>
                        ((optional<bool> *)in_stack_fffffffffffff830,
                         (bool *)in_stack_fffffffffffff828);
              *local_410 = local_416;
            }
          }
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff840);
          if (!bVar1) {
            local_418 = 0;
            local_420 = in_RDI + 0x1230;
            local_428._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(in_stack_fffffffffffff828);
            local_430 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end(in_stack_fffffffffffff828);
            while (bVar1 = __gnu_cxx::
                           operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffff830,
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffff828), ((bVar1 ^ 0xffU) & 1) != 0) {
              local_438 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_428);
              local_439 = 0;
              local_468 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff830);
              str._M_str = in_stack_fffffffffffff8a8;
              str._M_len = in_stack_fffffffffffff8a0;
              splitString(str,(char)((ulong)in_stack_fffffffffffff898 >> 0x38));
              sVar13 = std::
                       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::size(&local_458);
              if (sVar13 != 3) {
                local_439 = 1;
              }
              local_470 = &local_458;
              local_478._M_current =
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)in_stack_fffffffffffff828);
              local_480 = (basic_string_view<char,_std::char_traits<char>_> *)
                          std::
                          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)in_stack_fffffffffffff828);
              while (bVar1 = __gnu_cxx::
                             operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                       ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                         *)in_stack_fffffffffffff830,
                                        (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                         *)in_stack_fffffffffffff828), ((bVar1 ^ 0xffU) & 1) != 0) {
                pbVar14 = __gnu_cxx::
                          __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          ::operator*(&local_478);
                local_490._M_len = pbVar14->_M_len;
                local_490._M_str = pbVar14->_M_str;
                bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_490);
                if (bVar1) {
                  local_439 = 1;
                }
                local_498 = &local_490;
                local_4a0 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_498);
                local_4a8 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_498);
                for (; local_4a0 != local_4a8; local_4a0 = local_4a0 + 1) {
                  local_4a9 = *local_4a0;
                  bVar1 = isAlphaNumeric(local_4a9);
                  if ((!bVar1) && (local_4a9 != '_')) {
                    local_439 = 1;
                  }
                }
                __gnu_cxx::
                __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::operator++(&local_478);
              }
              if ((local_439 & 1) == 0) {
                std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[](&local_458,0);
                std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[](&local_458,1);
                std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::operator[](&local_458,2);
                std::
                vector<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
                ::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                          ((vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            *)in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                           in_stack_fffffffffffff840,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff838);
              }
              else {
                local_4e0 = "invalid format for translate-off-format: \'{}\'";
                local_4d8 = 0x2d;
                local_200 = local_4d0;
                local_210 = "invalid format for translate-off-format: \'{}\'";
                uStack_208 = 0x2d;
                local_218 = local_438;
                local_228 = "invalid format for translate-off-format: \'{}\'";
                uStack_220 = 0x2d;
                ::fmt::v11::detail::value<fmt::v11::context>::
                value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                          ((value<fmt::v11::context> *)in_stack_fffffffffffff840,
                           in_stack_fffffffffffff838);
                local_8 = &local_238;
                local_10 = local_248;
                local_238 = 0xd;
                fmt_04.data_._4_4_ = in_stack_fffffffffffffaa4;
                fmt_04.data_._0_4_ = in_stack_fffffffffffffaa0;
                fmt_04.size_._0_4_ = in_stack_fffffffffffffaa8;
                fmt_04.size_._4_4_ = in_stack_fffffffffffffaac;
                args_04.desc_._4_4_ = in_stack_fffffffffffffa94;
                args_04.desc_._0_4_ = in_stack_fffffffffffffa90;
                args_04.field_1._0_4_ = in_stack_fffffffffffffa98;
                args_04.field_1._4_4_ = in_stack_fffffffffffffa9c;
                local_230 = local_10;
                ::fmt::v11::vformat_abi_cxx11_(fmt_04,args_04);
                printError(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff830);
              }
              local_418 = (local_418 & 1) != 0 || (local_439 & 1) != 0;
              std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)in_stack_fffffffffffff840);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_428);
            }
            if ((local_418 & 1) != 0) {
              local_249 = 0;
              goto LAB_002c4d05;
            }
          }
          bVar1 = reportLoadErrors(in_stack_fffffffffffff858);
          if (bVar1) {
            bVar1 = SourceLoader::hasFiles((SourceLoader *)0x2c43bb);
            if (bVar1) {
              bVar1 = std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)0x2c4498);
              if (bVar1) {
                std::make_unique<slang::JsonWriter>();
                std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::
                operator=((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)
                          in_stack_fffffffffffff830,
                          (unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)
                          in_stack_fffffffffffff828);
                std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::
                ~unique_ptr((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>
                             *)in_stack_fffffffffffff830);
                this_00 = std::
                          unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::
                          operator->((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>
                                      *)0x2c44e5);
                JsonWriter::setPrettyPrint(this_00,true);
                std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::
                operator->((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *
                           )0x2c44fc);
                JsonWriter::startArray(in_stack_fffffffffffff850);
                std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::
                operator*((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)
                          in_stack_fffffffffffff830);
                std::make_shared<slang::JsonDiagnosticClient,slang::JsonWriter&>
                          ((JsonWriter *)in_stack_fffffffffffff858);
                std::shared_ptr<slang::JsonDiagnosticClient>::operator=
                          ((shared_ptr<slang::JsonDiagnosticClient> *)in_stack_fffffffffffff830,
                           (shared_ptr<slang::JsonDiagnosticClient> *)in_stack_fffffffffffff828);
                std::shared_ptr<slang::JsonDiagnosticClient>::~shared_ptr
                          ((shared_ptr<slang::JsonDiagnosticClient> *)0x2c454b);
                this_01 = std::
                          __shared_ptr_access<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x2c4555);
                bVar1 = std::optional<bool>::value_or<bool>
                                  ((optional<bool> *)in_stack_fffffffffffff838,
                                   (bool *)in_stack_fffffffffffff830);
                DiagnosticClient::showAbsPaths(&this_01->super_DiagnosticClient,bVar1);
                std::shared_ptr<slang::DiagnosticClient>::
                shared_ptr<slang::JsonDiagnosticClient,void>
                          ((shared_ptr<slang::DiagnosticClient> *)in_stack_fffffffffffff830,
                           (shared_ptr<slang::JsonDiagnosticClient> *)in_stack_fffffffffffff828);
                DiagnosticEngine::addClient
                          ((DiagnosticEngine *)in_stack_fffffffffffff830,
                           (shared_ptr<slang::DiagnosticClient> *)in_stack_fffffffffffff828);
                std::shared_ptr<slang::DiagnosticClient>::~shared_ptr
                          ((shared_ptr<slang::DiagnosticClient> *)0x2c45d3);
              }
              this_02 = (DiagnosticEngine *)
                        std::
                        __shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator*((__shared_ptr_access<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)in_stack_fffffffffffff830);
              TextDiagnosticClient::showColors
                        ((TextDiagnosticClient *)in_stack_fffffffffffff830,
                         SUB81((ulong)in_stack_fffffffffffff828 >> 0x38,0));
              this_03 = this_02;
              bVar1 = std::optional<bool>::value_or<bool>
                                ((optional<bool> *)this_02,(bool *)in_stack_fffffffffffff830);
              TextDiagnosticClient::showColumn((TextDiagnosticClient *)this_03,bVar1);
              this_04 = this_02;
              bVar1 = std::optional<bool>::value_or<bool>
                                ((optional<bool> *)this_03,(bool *)in_stack_fffffffffffff830);
              TextDiagnosticClient::showLocation((TextDiagnosticClient *)this_04,bVar1);
              pDVar18 = this_02;
              bVar1 = std::optional<bool>::value_or<bool>
                                ((optional<bool> *)this_03,(bool *)in_stack_fffffffffffff830);
              TextDiagnosticClient::showSourceLine((TextDiagnosticClient *)pDVar18,bVar1);
              pDVar18 = this_02;
              bVar1 = std::optional<bool>::value_or<bool>
                                ((optional<bool> *)this_03,(bool *)in_stack_fffffffffffff830);
              TextDiagnosticClient::showOptionName((TextDiagnosticClient *)pDVar18,bVar1);
              severity = (DiagnosticSeverity)((ulong)pDVar18 >> 0x20);
              pDVar18 = this_02;
              bVar1 = std::optional<bool>::value_or<bool>
                                ((optional<bool> *)this_03,(bool *)in_stack_fffffffffffff830);
              TextDiagnosticClient::showIncludeStack((TextDiagnosticClient *)pDVar18,bVar1);
              pDVar15 = this_02;
              bVar1 = std::optional<bool>::value_or<bool>
                                ((optional<bool> *)this_03,(bool *)in_stack_fffffffffffff830);
              TextDiagnosticClient::showMacroExpansion((TextDiagnosticClient *)pDVar15,bVar1);
              code = SUB84((ulong)pDVar15 >> 0x20,0);
              pDVar15 = this_02;
              bVar1 = std::optional<bool>::value_or<bool>
                                ((optional<bool> *)this_03,(bool *)in_stack_fffffffffffff830);
              DiagnosticClient::showAbsPaths((DiagnosticClient *)pDVar15,bVar1);
              _Var8 = std::operator==(&in_stack_fffffffffffff830->languageVersion,
                                      (char (*) [7])in_stack_fffffffffffff828);
              if (_Var8) {
                TextDiagnosticClient::showHierarchyInstance((TextDiagnosticClient *)this_02,Always);
              }
              else {
                _Var9 = std::operator==(&in_stack_fffffffffffff830->languageVersion,
                                        (char (*) [6])in_stack_fffffffffffff828);
                if (_Var9) {
                  TextDiagnosticClient::showHierarchyInstance((TextDiagnosticClient *)this_02,Never)
                  ;
                }
              }
              pDVar15 = (DiagnosticEngine *)(in_RDI + 0xe98);
              limit = std::optional<unsigned_int>::value_or<int>
                                ((optional<unsigned_int> *)this_03,(int *)pDVar15);
              DiagnosticEngine::setErrorLimit(pDVar15,limit);
              DiagnosticEngine::setDefaultWarnings(this_04);
              DiagnosticEngine::setSeverity(pDVar18,code,severity);
              DiagnosticEngine::setSeverity(pDVar18,code,severity);
              DiagnosticEngine::setSeverity(pDVar18,code,severity);
              _Var10 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)pDVar15,(char (*) [4])in_stack_fffffffffffff828);
              if (_Var10) {
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
              }
              else {
                local_574 = 0xc40007;
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                local_578 = 0xd00007;
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                local_57c = 0xd10007;
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                local_580 = 0xf00006;
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                local_584 = 0xca0005;
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                local_588 = 0xc30005;
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
                local_58c = 0xd60007;
                DiagnosticEngine::setSeverity(pDVar18,code,severity);
              }
              std::
              span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
              ::
              span<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                        ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
                          *)this_04,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_03);
              options._M_extent._M_extent_value = in_stack_fffffffffffff968._M_extent_value;
              options._M_ptr = in_stack_fffffffffffff960;
              DiagnosticEngine::setWarningOptions(in_stack_fffffffffffff958,options);
              this_05 = &local_688;
              pDVar16 = SmallVectorBase<slang::Diagnostic>::begin(this_05);
              pDVar17 = SmallVectorBase<slang::Diagnostic>::end(this_05);
              for (; pDVar16 != pDVar17; pDVar16 = pDVar16 + 1) {
                DiagnosticEngine::issue
                          (in_stack_fffffffffffff8f0,
                           (Diagnostic *)CONCAT17(bVar20,in_stack_fffffffffffff8e8));
              }
              local_249 = 1;
              Diagnostics::~Diagnostics((Diagnostics *)0x2c4d05);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                         in_stack_fffffffffffff860);
              printError(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff830);
              std::allocator<char>::~allocator(local_501);
              local_249 = 0;
            }
          }
          else {
            local_249 = 0;
          }
        }
        else {
          local_408 = "invalid value for time scale option: \'{}\'";
          local_400 = 0x29;
          local_1c8 = std::
                      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)0x2c3d05);
          local_1b0 = local_3f8;
          local_1c0 = local_408;
          uStack_1b8 = local_400;
          local_1d8 = local_408;
          uStack_1d0 = local_400;
          puVar19 = local_1f8;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff840,in_stack_fffffffffffff838
                    );
          local_18 = &local_1e8;
          local_1e8 = 0xd;
          fmt_03.data_._4_4_ = in_stack_fffffffffffffaa4;
          fmt_03.data_._0_4_ = in_stack_fffffffffffffaa0;
          fmt_03.size_._0_4_ = in_stack_fffffffffffffaa8;
          fmt_03.size_._4_4_ = in_stack_fffffffffffffaac;
          args_03.desc_._4_4_ = in_stack_fffffffffffffa94;
          args_03.desc_._0_4_ = in_stack_fffffffffffffa90;
          args_03.field_1._0_4_ = in_stack_fffffffffffffa98;
          args_03.field_1._4_4_ = in_stack_fffffffffffffa9c;
          local_20 = puVar19;
          local_1e0 = puVar19;
          ::fmt::v11::vformat_abi_cxx11_(fmt_03,args_03);
          printError(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff830);
          local_249 = 0;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
        printError(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff830);
        std::allocator<char>::~allocator(local_3c1);
        local_249 = 0;
      }
    }
  }
LAB_002c4d05:
  return (bool)(local_249 & 1);
}

Assistant:

bool Driver::processOptions() {
    bool showColors;
    if (options.colorDiags.has_value())
        showColors = *options.colorDiags;
    else
        showColors = OS::fileSupportsColors(stderr);

    if (showColors) {
        OS::setStderrColorsEnabled(true);
        if (OS::fileSupportsColors(stdout))
            OS::setStdoutColorsEnabled(true);
    }

    if (options.languageVersion.has_value()) {
        if (options.languageVersion == "1800-2017")
            languageVersion = LanguageVersion::v1800_2017;
        else if (options.languageVersion == "1800-2023" || options.languageVersion == "latest")
            languageVersion = LanguageVersion::v1800_2023;
        else {
            printError(
                fmt::format("invalid value for --std option: '{}'", *options.languageVersion));
            return false;
        }
    }

    if (options.compat.has_value()) {
        if (options.compat == "vcs") {
            auto vcsCompatFlags = {CompilationFlags::AllowHierarchicalConst,
                                   CompilationFlags::AllowUseBeforeDeclare,
                                   CompilationFlags::RelaxEnumConversions,
                                   CompilationFlags::RelaxStringConversions,
                                   CompilationFlags::AllowRecursiveImplicitCall,
                                   CompilationFlags::AllowBareValParamAssignment,
                                   CompilationFlags::AllowSelfDeterminedStreamConcat,
                                   CompilationFlags::AllowMultiDrivenLocals,
                                   CompilationFlags::AllowMergingAnsiPorts};

            for (auto flag : vcsCompatFlags) {
                auto& option = options.compilationFlags.at(flag);
                if (!option.has_value())
                    option = true;
            }
        }
        else {
            printError(fmt::format("invalid value for compat option: '{}'", *options.compat));
            return false;
        }
    }

    if (options.minTypMax.has_value() && options.minTypMax != "min" && options.minTypMax != "typ" &&
        options.minTypMax != "max") {
        printError(fmt::format("invalid value for timing option: '{}'", *options.minTypMax));
        return false;
    }

    if (options.diagHierarchy.has_value() && options.diagHierarchy != "always" &&
        options.diagHierarchy != "never" && options.diagHierarchy != "auto") {
        printError(
            fmt::format("invalid value for diag-hierarchy option: '{}'", *options.diagHierarchy));
        return false;
    }

    if (options.librariesInheritMacros == true && !options.singleUnit.value_or(false)) {
        printError("--single-unit must be set when --libraries-inherit-macros is used");
        return false;
    }

    if (options.timeScale.has_value() && !TimeScale::fromString(*options.timeScale)) {
        printError(fmt::format("invalid value for time scale option: '{}'", *options.timeScale));
        return false;
    }

    if (options.lintMode()) {
        auto& opt = options.compilationFlags.at(CompilationFlags::IgnoreUnknownModules);
        if (!opt.has_value())
            opt = true;
    }

    if (!options.translateOffOptions.empty()) {
        bool anyBad = false;
        for (auto& fmtStr : options.translateOffOptions) {
            bool bad = false;
            auto parts = splitString(fmtStr, ',');
            if (parts.size() != 3)
                bad = true;

            for (auto part : parts) {
                if (part.empty())
                    bad = true;

                for (char c : part) {
                    if (!isAlphaNumeric(c) && c != '_')
                        bad = true;
                }
            }

            if (bad)
                printError(fmt::format("invalid format for translate-off-format: '{}'", fmtStr));
            else
                translateOffFormats.emplace_back(parts[0], parts[1], parts[2]);

            anyBad |= bad;
        }

        if (anyBad)
            return false;
    }

    if (!reportLoadErrors())
        return false;

    if (!sourceLoader.hasFiles()) {
        printError("no input files");
        return false;
    }

    if (options.diagJson.has_value()) {
        jsonWriter = std::make_unique<JsonWriter>();
        jsonWriter->setPrettyPrint(true);
        jsonWriter->startArray();

        jsonDiagClient = std::make_shared<JsonDiagnosticClient>(*jsonWriter);
        jsonDiagClient->showAbsPaths(options.diagAbsPaths.value_or(false));
        diagEngine.addClient(jsonDiagClient);
    }

    auto& tdc = *textDiagClient;
    tdc.showColors(showColors);
    tdc.showColumn(options.diagColumn.value_or(true));
    tdc.showLocation(options.diagLocation.value_or(true));
    tdc.showSourceLine(options.diagSourceLine.value_or(true));
    tdc.showOptionName(options.diagOptionName.value_or(true));
    tdc.showIncludeStack(options.diagIncludeStack.value_or(true));
    tdc.showMacroExpansion(options.diagMacroExpansion.value_or(true));
    tdc.showAbsPaths(options.diagAbsPaths.value_or(false));

    if (options.diagHierarchy == "always")
        tdc.showHierarchyInstance(ShowHierarchyPathOption::Always);
    else if (options.diagHierarchy == "never")
        tdc.showHierarchyInstance(ShowHierarchyPathOption::Never);

    diagEngine.setErrorLimit((int)options.errorLimit.value_or(20));
    diagEngine.setDefaultWarnings();

    // Some tools violate the standard in various ways, but in order to allow
    // compatibility with these tools we change the respective errors into a
    // suppressible warning that we promote to an error by default. This allows
    // the user to turn this back into a warning, or turn it off altogether.

    diagEngine.setSeverity(diag::DuplicateDefinition, DiagnosticSeverity::Error);
    diagEngine.setSeverity(diag::BadProceduralForce, DiagnosticSeverity::Error);
    diagEngine.setSeverity(diag::UnknownSystemName, DiagnosticSeverity::Error);

    if (options.compat == "vcs") {
        diagEngine.setSeverity(diag::StaticInitializerMustBeExplicit, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::ImplicitConvert, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::BadFinishNum, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::NonstandardSysFunc, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::NonstandardForeach, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::NonstandardDist, DiagnosticSeverity::Ignored);
    }
    else {
        // These warnings are set to Error severity by default, unless we're in vcs compat mode.
        // The user can always downgrade via warning options, which get set after this.
        diagEngine.setSeverity(diag::IndexOOB, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::RangeOOB, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::RangeWidthOOB, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::ImplicitNamedPortTypeMismatch, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::SplitDistWeightOp, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::DPIPureTask, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::SpecifyPathConditionExpr, DiagnosticSeverity::Error);
    }

    Diagnostics optionDiags = diagEngine.setWarningOptions(options.warningOptions);
    for (auto& diag : optionDiags)
        diagEngine.issue(diag);

    return true;
}